

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O0

void cfl_predict_lbd_ssse3
               (int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3,int width,int height)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  __m128i dc_q0_00;
  __m128i dc_q0_01;
  __m128i dc_q0_02;
  ushort uVar7;
  undefined2 in_CX;
  long lVar8;
  int iVar9;
  longlong in_RDX;
  __m128i *in_RSI;
  __m128i *in_RDI;
  int iVar10;
  longlong in_R8;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i alVar12;
  __m128i alpha_q12_00;
  __m128i a;
  __m128i alpha_q12_01;
  __m128i alpha_q12_02;
  __m128i alpha_q12_03;
  __m128i alpha_sign_00;
  __m128i alpha_sign_01;
  __m128i alpha_sign_02;
  __m128i alpha_sign_03;
  __m128i next;
  __m128i res;
  __m128i *row_end;
  __m128i *row;
  __m128i dc_q0;
  __m128i alpha_q12;
  __m128i alpha_sign;
  undefined1 in_stack_fffffffffffffe38 [12];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  __m128i *local_190;
  __m128i *local_148;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  longlong extraout_RDX;
  
  iVar9 = (int)in_RDX;
  iVar10 = (int)in_R8;
  auVar11._2_2_ = in_CX;
  auVar11._0_2_ = in_CX;
  auVar11._4_2_ = in_CX;
  auVar11._6_2_ = in_CX;
  auVar11._10_2_ = in_CX;
  auVar11._8_2_ = in_CX;
  auVar11._12_2_ = in_CX;
  auVar11._14_2_ = in_CX;
  auVar11 = pabsw(auVar11,auVar11);
  psllw(auVar11,ZEXT416(9));
  uVar7 = (ushort)(byte)(*in_RSI)[0];
  lVar8 = (long)(in_R9D << 2) * 0x10;
  local_190 = in_RDI;
  local_148 = in_RSI;
  do {
    alVar12[1]._4_2_ = in_CX;
    alVar12._0_12_ = in_stack_fffffffffffffe38;
    alVar12[1]._6_2_ = uVar7;
    alpha_q12_00[1] = in_RDX;
    alpha_q12_00[0] = (longlong)in_RSI;
    alpha_sign_00[1] = in_R8;
    alpha_sign_00[0] = lVar8;
    alVar12 = predict_unclipped(local_190,alpha_q12_00,alpha_sign_00,alVar12);
    a[1] = alVar12[1];
    local_58 = (short)extraout_XMM0_Qa;
    sStack_56 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
    sStack_54 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
    sStack_52 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
    sStack_50 = (short)extraout_XMM0_Qb;
    sStack_4e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
    sStack_4c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
    sStack_4a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
    cVar1 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cVar2 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cVar3 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cVar4 = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cVar5 = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cVar6 = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    if (iVar10 < 0x10) {
      local_1a8._0_2_ =
           CONCAT11((0 < sStack_56) * (sStack_56 < 0x100) * cVar1 - (0xff < sStack_56),
                    (0 < local_58) * (local_58 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_58)
                   );
      local_1a8._0_3_ =
           CONCAT12((0 < sStack_54) * (sStack_54 < 0x100) * cVar2 - (0xff < sStack_54),
                    (undefined2)local_1a8);
      local_1a8._0_4_ =
           CONCAT13((0 < sStack_52) * (sStack_52 < 0x100) * cVar3 - (0xff < sStack_52),
                    (undefined3)local_1a8);
      local_1a8._0_5_ =
           CONCAT14((0 < sStack_50) * (sStack_50 < 0x100) * (char)extraout_XMM0_Qb -
                    (0xff < sStack_50),(undefined4)local_1a8);
      local_1a8._0_6_ =
           CONCAT15((0 < sStack_4e) * (sStack_4e < 0x100) * cVar4 - (0xff < sStack_4e),
                    (undefined5)local_1a8);
      local_1a8._0_7_ =
           CONCAT16((0 < sStack_4c) * (sStack_4c < 0x100) * cVar5 - (0xff < sStack_4c),
                    (undefined6)local_1a8);
      local_1a8 = CONCAT17((0 < sStack_4a) * (sStack_4a < 0x100) * cVar6 - (0xff < sStack_4a),
                           (undefined7)local_1a8);
      if (iVar10 == 4) {
        a[0] = (longlong)in_RSI;
        _mm_storeh_epi32(local_148,a);
        alpha_q12_02[1] = extraout_RDX;
      }
      else {
        (*local_148)[0] = local_1a8;
        alpha_q12_02[1] = a[1];
      }
    }
    else {
      dc_q0_00[1]._4_2_ = in_CX;
      dc_q0_00._0_12_ = in_stack_fffffffffffffe38;
      dc_q0_00[1]._6_2_ = uVar7;
      alpha_q12_01[1] = a[1];
      alpha_q12_01[0] = (longlong)in_RSI;
      alpha_sign_01[1] = in_R8;
      alpha_sign_01[0] = lVar8;
      alVar12 = predict_unclipped(local_190 + 1,alpha_q12_01,alpha_sign_01,dc_q0_00);
      alpha_q12_02[1] = alVar12[1];
      local_88 = (short)extraout_XMM0_Qa_00;
      sStack_86 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      sStack_84 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      sStack_82 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      sStack_80 = (short)extraout_XMM0_Qb_00;
      sStack_7e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      sStack_7c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      sStack_7a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      local_1a8._0_2_ =
           CONCAT11((0 < sStack_56) * (sStack_56 < 0x100) * cVar1 - (0xff < sStack_56),
                    (0 < local_58) * (local_58 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_58)
                   );
      local_1a8._0_3_ =
           CONCAT12((0 < sStack_54) * (sStack_54 < 0x100) * cVar2 - (0xff < sStack_54),
                    (undefined2)local_1a8);
      local_1a8._0_4_ =
           CONCAT13((0 < sStack_52) * (sStack_52 < 0x100) * cVar3 - (0xff < sStack_52),
                    (undefined3)local_1a8);
      local_1a8._0_5_ =
           CONCAT14((0 < sStack_50) * (sStack_50 < 0x100) * (char)extraout_XMM0_Qb -
                    (0xff < sStack_50),(undefined4)local_1a8);
      local_1a8._0_6_ =
           CONCAT15((0 < sStack_4e) * (sStack_4e < 0x100) * cVar4 - (0xff < sStack_4e),
                    (undefined5)local_1a8);
      local_1a8._0_7_ =
           CONCAT16((0 < sStack_4c) * (sStack_4c < 0x100) * cVar5 - (0xff < sStack_4c),
                    (undefined6)local_1a8);
      local_1a8 = CONCAT17((0 < sStack_4a) * (sStack_4a < 0x100) * cVar6 - (0xff < sStack_4a),
                           (undefined7)local_1a8);
      uStack_1a0._0_2_ =
           CONCAT11((0 < sStack_86) * (sStack_86 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_00 >> 0x10) - (0xff < sStack_86),
                    (0 < local_88) * (local_88 < 0x100) * (char)extraout_XMM0_Qa_00 -
                    (0xff < local_88));
      uStack_1a0._0_3_ =
           CONCAT12((0 < sStack_84) * (sStack_84 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_00 >> 0x20) - (0xff < sStack_84),
                    (undefined2)uStack_1a0);
      uStack_1a0._0_4_ =
           CONCAT13((0 < sStack_82) * (sStack_82 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_00 >> 0x30) - (0xff < sStack_82),
                    (undefined3)uStack_1a0);
      uStack_1a0._0_5_ =
           CONCAT14((0 < sStack_80) * (sStack_80 < 0x100) * (char)extraout_XMM0_Qb_00 -
                    (0xff < sStack_80),(undefined4)uStack_1a0);
      uStack_1a0._0_6_ =
           CONCAT15((0 < sStack_7e) * (sStack_7e < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) - (0xff < sStack_7e),
                    (undefined5)uStack_1a0);
      uStack_1a0._0_7_ =
           CONCAT16((0 < sStack_7c) * (sStack_7c < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) - (0xff < sStack_7c),
                    (undefined6)uStack_1a0);
      uStack_1a0 = CONCAT17((0 < sStack_7a) * (sStack_7a < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_7a),
                            (undefined7)uStack_1a0);
      (*local_148)[0] = local_1a8;
      (*local_148)[1] = uStack_1a0;
      if (iVar10 == 0x20) {
        dc_q0_01[1]._4_2_ = in_CX;
        dc_q0_01._0_12_ = in_stack_fffffffffffffe38;
        dc_q0_01[1]._6_2_ = uVar7;
        alpha_q12_02[0] = (longlong)in_RSI;
        alpha_sign_02[1] = in_R8;
        alpha_sign_02[0] = lVar8;
        alVar12 = predict_unclipped(local_190 + 2,alpha_q12_02,alpha_sign_02,dc_q0_01);
        alpha_q12_03[1] = alVar12[1];
        dc_q0_02[1]._4_2_ = in_CX;
        dc_q0_02._0_12_ = in_stack_fffffffffffffe38;
        dc_q0_02[1]._6_2_ = uVar7;
        alpha_q12_03[0] = (longlong)in_RSI;
        alpha_sign_03[1] = in_R8;
        alpha_sign_03[0] = lVar8;
        alVar12 = predict_unclipped(local_190 + 3,alpha_q12_03,alpha_sign_03,dc_q0_02);
        alpha_q12_02[1] = alVar12[1];
        local_98 = (short)extraout_XMM0_Qa_01;
        sStack_96 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
        sStack_94 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
        sStack_92 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
        sStack_90 = (short)extraout_XMM0_Qb_01;
        sStack_8e = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
        sStack_8c = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
        sStack_8a = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
        local_a8 = (short)extraout_XMM0_Qa_02;
        sStack_a6 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
        sStack_a4 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
        sStack_a2 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
        sStack_a0 = (short)extraout_XMM0_Qb_02;
        sStack_9e = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
        sStack_9c = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
        sStack_9a = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
        local_1a8._0_2_ =
             CONCAT11((0 < sStack_96) * (sStack_96 < 0x100) *
                      (char)((ulong)extraout_XMM0_Qa_01 >> 0x10) - (0xff < sStack_96),
                      (0 < local_98) * (local_98 < 0x100) * (char)extraout_XMM0_Qa_01 -
                      (0xff < local_98));
        local_1a8._0_3_ =
             CONCAT12((0 < sStack_94) * (sStack_94 < 0x100) *
                      (char)((ulong)extraout_XMM0_Qa_01 >> 0x20) - (0xff < sStack_94),
                      (undefined2)local_1a8);
        local_1a8._0_4_ =
             CONCAT13((0 < sStack_92) * (sStack_92 < 0x100) *
                      (char)((ulong)extraout_XMM0_Qa_01 >> 0x30) - (0xff < sStack_92),
                      (undefined3)local_1a8);
        local_1a8._0_5_ =
             CONCAT14((0 < sStack_90) * (sStack_90 < 0x100) * (char)extraout_XMM0_Qb_01 -
                      (0xff < sStack_90),(undefined4)local_1a8);
        local_1a8._0_6_ =
             CONCAT15((0 < sStack_8e) * (sStack_8e < 0x100) *
                      (char)((ulong)extraout_XMM0_Qb_01 >> 0x10) - (0xff < sStack_8e),
                      (undefined5)local_1a8);
        local_1a8._0_7_ =
             CONCAT16((0 < sStack_8c) * (sStack_8c < 0x100) *
                      (char)((ulong)extraout_XMM0_Qb_01 >> 0x20) - (0xff < sStack_8c),
                      (undefined6)local_1a8);
        local_1a8 = CONCAT17((0 < sStack_8a) * (sStack_8a < 0x100) *
                             (char)((ulong)extraout_XMM0_Qb_01 >> 0x30) - (0xff < sStack_8a),
                             (undefined7)local_1a8);
        uStack_1a0._0_2_ =
             CONCAT11((0 < sStack_a6) * (sStack_a6 < 0x100) *
                      (char)((ulong)extraout_XMM0_Qa_02 >> 0x10) - (0xff < sStack_a6),
                      (0 < local_a8) * (local_a8 < 0x100) * (char)extraout_XMM0_Qa_02 -
                      (0xff < local_a8));
        uStack_1a0._0_3_ =
             CONCAT12((0 < sStack_a4) * (sStack_a4 < 0x100) *
                      (char)((ulong)extraout_XMM0_Qa_02 >> 0x20) - (0xff < sStack_a4),
                      (undefined2)uStack_1a0);
        uStack_1a0._0_4_ =
             CONCAT13((0 < sStack_a2) * (sStack_a2 < 0x100) *
                      (char)((ulong)extraout_XMM0_Qa_02 >> 0x30) - (0xff < sStack_a2),
                      (undefined3)uStack_1a0);
        uStack_1a0._0_5_ =
             CONCAT14((0 < sStack_a0) * (sStack_a0 < 0x100) * (char)extraout_XMM0_Qb_02 -
                      (0xff < sStack_a0),(undefined4)uStack_1a0);
        uStack_1a0._0_6_ =
             CONCAT15((0 < sStack_9e) * (sStack_9e < 0x100) *
                      (char)((ulong)extraout_XMM0_Qb_02 >> 0x10) - (0xff < sStack_9e),
                      (undefined5)uStack_1a0);
        uStack_1a0._0_7_ =
             CONCAT16((0 < sStack_9c) * (sStack_9c < 0x100) *
                      (char)((ulong)extraout_XMM0_Qb_02 >> 0x20) - (0xff < sStack_9c),
                      (undefined6)uStack_1a0);
        uStack_1a0 = CONCAT17((0 < sStack_9a) * (sStack_9a < 0x100) *
                              (char)((ulong)extraout_XMM0_Qb_02 >> 0x30) - (0xff < sStack_9a),
                              (undefined7)uStack_1a0);
        local_148[1][0] = local_1a8;
        local_148[1][1] = uStack_1a0;
      }
    }
    lVar8 = (long)iVar9;
    local_148 = (__m128i *)((long)*local_148 + lVar8);
    local_190 = local_190 + 4;
    in_RDX = alpha_q12_02[1];
  } while (local_190 < in_RDI + (in_R9D << 2));
  return;
}

Assistant:

static inline void cfl_predict_lbd_ssse3(const int16_t *pred_buf_q3,
                                         uint8_t *dst, int dst_stride,
                                         int alpha_q3, int width, int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    if (width < 16) {
      res = _mm_packus_epi16(res, res);
      if (width == 4)
        _mm_storeh_epi32((__m128i *)dst, res);
      else
        _mm_storel_epi64((__m128i *)dst, res);
    } else {
      __m128i next = predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      res = _mm_packus_epi16(res, next);
      _mm_storeu_si128((__m128i *)dst, res);
      if (width == 32) {
        res = predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
        next = predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
        res = _mm_packus_epi16(res, next);
        _mm_storeu_si128((__m128i *)(dst + 16), res);
      }
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}